

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_sse4.c
# Opt level: O1

uint aom_highbd_10_variance4x4_sse4_1(uint8_t *a,int a_stride,uint8_t *b,int b_stride,uint32_t *sse)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  short sVar19;
  short sVar20;
  short sVar21;
  undefined1 auVar18 [16];
  undefined1 auVar13 [16];
  short sVar15;
  short sVar16;
  short sVar17;
  
  uVar1 = *(undefined8 *)((long)a * 2);
  uVar2 = *(undefined8 *)((long)a_stride * 2 + (long)a * 2);
  uVar3 = *(undefined8 *)((long)(a_stride * 2) * 2 + (long)a * 2);
  uVar4 = *(undefined8 *)((long)(a_stride * 3) * 2 + (long)a * 2);
  uVar5 = *(undefined8 *)((long)b * 2);
  uVar6 = *(undefined8 *)((long)b_stride * 2 + (long)b * 2);
  auVar10._0_2_ = (short)uVar1 - (short)uVar5;
  auVar10._2_2_ = (short)uVar2 - (short)uVar6;
  auVar10._4_2_ = (short)((ulong)uVar1 >> 0x10) - (short)((ulong)uVar5 >> 0x10);
  auVar10._6_2_ = (short)((ulong)uVar2 >> 0x10) - (short)((ulong)uVar6 >> 0x10);
  auVar10._8_2_ = (short)((ulong)uVar1 >> 0x20) - (short)((ulong)uVar5 >> 0x20);
  auVar10._10_2_ = (short)((ulong)uVar2 >> 0x20) - (short)((ulong)uVar6 >> 0x20);
  auVar10._12_2_ = (short)((ulong)uVar1 >> 0x30) - (short)((ulong)uVar5 >> 0x30);
  auVar10._14_2_ = (short)((ulong)uVar2 >> 0x30) - (short)((ulong)uVar6 >> 0x30);
  uVar8 = *(ulong *)((long)(b_stride * 2) * 2 + (long)b * 2);
  uVar1 = *(undefined8 *)((long)(b_stride * 3) * 2 + (long)b * 2);
  sVar21 = (short)((ulong)uVar1 >> 0x30);
  sVar17 = (short)(uVar8 >> 0x30);
  auVar18._8_4_ = 0;
  auVar18._0_8_ = uVar8;
  auVar18._12_2_ = sVar17;
  auVar18._14_2_ = sVar21;
  auVar13._12_4_ = auVar18._12_4_;
  auVar13._8_2_ = 0;
  auVar13._0_8_ = uVar8;
  sVar20 = (short)((ulong)uVar1 >> 0x20);
  auVar13._10_2_ = sVar20;
  sVar16 = (short)(uVar8 >> 0x20);
  auVar14._10_6_ = auVar13._10_6_;
  auVar14._8_2_ = sVar16;
  auVar14._0_8_ = uVar8;
  auVar12._8_8_ = auVar14._8_8_;
  sVar19 = (short)((ulong)uVar1 >> 0x10);
  auVar12._6_2_ = sVar19;
  sVar15 = (short)(uVar8 >> 0x10);
  auVar12._4_2_ = sVar15;
  auVar12._0_2_ = (short)uVar8;
  auVar12._2_2_ = (short)uVar1;
  auVar11._0_2_ = (short)uVar3 - auVar12._0_2_;
  auVar11._2_2_ = (short)uVar4 - (short)uVar1;
  auVar11._4_2_ = (short)((ulong)uVar3 >> 0x10) - sVar15;
  auVar11._6_2_ = (short)((ulong)uVar4 >> 0x10) - sVar19;
  auVar11._8_2_ = (short)((ulong)uVar3 >> 0x20) - sVar16;
  auVar11._10_2_ = (short)((ulong)uVar4 >> 0x20) - sVar20;
  auVar11._12_2_ = (short)((ulong)uVar3 >> 0x30) - sVar17;
  auVar11._14_2_ = (short)((ulong)uVar4 >> 0x30) - sVar21;
  auVar14 = pmovsxbw(auVar12,0x101010101010101);
  auVar18 = pmaddwd(auVar10,auVar14);
  auVar14 = pmaddwd(auVar14,auVar11);
  auVar14 = phaddd(auVar18,auVar14);
  auVar14 = phaddd(auVar14,auVar14);
  auVar14 = phaddd(auVar14,auVar14);
  auVar10 = pmaddwd(auVar10,auVar10);
  auVar11 = pmaddwd(auVar11,auVar11);
  auVar10 = phaddd(auVar10,auVar11);
  auVar10 = phaddd(auVar10,auVar10);
  auVar10 = phaddd(auVar10,auVar10);
  uVar8 = (long)auVar10._0_4_ + 8U >> 4;
  *sse = (uint32_t)uVar8;
  lVar9 = (long)auVar14._0_4_ + 2 >> 2;
  lVar9 = (uVar8 & 0xffffffff) - ((ulong)(lVar9 * lVar9) >> 4);
  uVar7 = (uint)lVar9;
  if (lVar9 < 0) {
    uVar7 = 0;
  }
  return uVar7;
}

Assistant:

static inline void variance4x4_64_sse4_1(const uint8_t *a8, int a_stride,
                                         const uint8_t *b8, int b_stride,
                                         uint64_t *sse, int64_t *sum) {
  __m128i u0, u1, u2, u3;
  __m128i s0, s1, s2, s3;
  __m128i t0, t1, x0, y0;
  __m128i a0, a1, a2, a3;
  __m128i b0, b1, b2, b3;
  __m128i k_one_epi16 = _mm_set1_epi16((int16_t)1);

  uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  uint16_t *b = CONVERT_TO_SHORTPTR(b8);

  a0 = _mm_loadl_epi64((__m128i const *)(a + 0 * a_stride));
  a1 = _mm_loadl_epi64((__m128i const *)(a + 1 * a_stride));
  a2 = _mm_loadl_epi64((__m128i const *)(a + 2 * a_stride));
  a3 = _mm_loadl_epi64((__m128i const *)(a + 3 * a_stride));

  b0 = _mm_loadl_epi64((__m128i const *)(b + 0 * b_stride));
  b1 = _mm_loadl_epi64((__m128i const *)(b + 1 * b_stride));
  b2 = _mm_loadl_epi64((__m128i const *)(b + 2 * b_stride));
  b3 = _mm_loadl_epi64((__m128i const *)(b + 3 * b_stride));

  u0 = _mm_unpacklo_epi16(a0, a1);
  u1 = _mm_unpacklo_epi16(a2, a3);
  u2 = _mm_unpacklo_epi16(b0, b1);
  u3 = _mm_unpacklo_epi16(b2, b3);

  s0 = _mm_sub_epi16(u0, u2);
  s1 = _mm_sub_epi16(u1, u3);

  t0 = _mm_madd_epi16(s0, k_one_epi16);
  t1 = _mm_madd_epi16(s1, k_one_epi16);

  s2 = _mm_hadd_epi32(t0, t1);
  s3 = _mm_hadd_epi32(s2, s2);
  y0 = _mm_hadd_epi32(s3, s3);

  t0 = _mm_madd_epi16(s0, s0);
  t1 = _mm_madd_epi16(s1, s1);

  s2 = _mm_hadd_epi32(t0, t1);
  s3 = _mm_hadd_epi32(s2, s2);
  x0 = _mm_hadd_epi32(s3, s3);

  *sse = (uint64_t)_mm_extract_epi32(x0, 0);
  *sum = (int64_t)_mm_extract_epi32(y0, 0);
}